

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

void IoTHubClientCore_LL_SendComplete
               (PDLIST_ENTRY completed,IOTHUB_CLIENT_CONFIRMATION_RESULT result,void *ctx)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  PDLIST_ENTRY pDVar1;
  
  if (completed == (PDLIST_ENTRY)0x0 || ctx == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                 ,"IoTHubClientCore_LL_SendComplete",0x21f,1,"invalid arg");
      return;
    }
  }
  else {
    pDVar1 = DList_RemoveHeadList(completed);
    while (pDVar1 != completed) {
      if (pDVar1[-1].Flink != (DLIST_ENTRY_TAG *)0x0) {
        (*(code *)pDVar1[-1].Flink)(result,pDVar1[-1].Blink);
      }
      IoTHubMessage_Destroy((IOTHUB_MESSAGE_HANDLE)pDVar1[-2].Blink);
      free(&pDVar1[-2].Blink);
      pDVar1 = DList_RemoveHeadList(completed);
    }
  }
  return;
}

Assistant:

static void IoTHubClientCore_LL_SendComplete(PDLIST_ENTRY completed, IOTHUB_CLIENT_CONFIRMATION_RESULT result, void* ctx)
{
    if (
        (ctx == NULL) ||
        (completed == NULL)
        )
    {
        /*"shall return"*/
        LogError("invalid arg");
    }
    else
    {
        PDLIST_ENTRY oldest;
        while ((oldest = DList_RemoveHeadList(completed)) != completed)
        {
            IOTHUB_MESSAGE_LIST* messageList = (IOTHUB_MESSAGE_LIST*)containingRecord(oldest, IOTHUB_MESSAGE_LIST, entry);
            if (messageList->callback != NULL)
            {
                messageList->callback(result, messageList->context);
            }
            IoTHubMessage_Destroy(messageList->messageHandle);
            free(messageList);
        }
    }
}